

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O2

void __thiscall sqlite::database::database(database *this,string *db_name,sqlite_config *config)

{
  int iVar1;
  undefined8 extraout_RAX;
  char *pcVar2;
  str_ref sql;
  str_ref sql_00;
  __shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2> local_60;
  sqlite3 *tmp;
  database_binder local_48;
  
  (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tmp = (sqlite3 *)0x0;
  pcVar2 = config->zVfs;
  iVar1 = sqlite3_open_v2((db_name->_M_dataplus)._M_p,&tmp,config->flags);
  std::__shared_ptr<sqlite3,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sqlite3,sqlite::database::database(std::__cxx11::string_const&,sqlite::sqlite_config_const&)::_lambda(sqlite3*)_1_,void>
            ((__shared_ptr<sqlite3,(__gnu_cxx::_Lock_policy)2> *)&local_60,tmp);
  std::__shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2> *)this,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  if (iVar1 == 0) {
    sqlite3_extended_result_codes
              ((this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    if (config->encoding == UTF16) {
      sql._M_str = "PRAGMA encoding = \"UTF-16\";";
      sql._M_len = 0x1b;
      operator<<(&local_48,this,sql);
      database_binder::~database_binder(&local_48);
    }
    return;
  }
  if ((this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = sqlite3_extended_errcode();
  }
  sql_00._M_str = pcVar2;
  sql_00._M_len = (size_t)"";
  local_60._M_ptr._0_4_ = iVar1;
  errors::throw_sqlite_error((errors *)&local_60,(int *)0x0,sql_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

database(const std::string &db_name, const sqlite_config &config = {}): _db(nullptr) {
			sqlite3* tmp = nullptr;
			auto ret = sqlite3_open_v2(db_name.data(), &tmp, static_cast<int>(config.flags), config.zVfs);
			_db = std::shared_ptr<sqlite3>(tmp, [=](sqlite3* ptr) { sqlite3_close_v2(ptr); }); // this will close the connection eventually when no longer needed.
			if(ret != SQLITE_OK) errors::throw_sqlite_error(_db ? sqlite3_extended_errcode(_db.get()) : ret);
			sqlite3_extended_result_codes(_db.get(), true);
			if(config.encoding == Encoding::UTF16)
				*this << R"(PRAGMA encoding = "UTF-16";)";
		}